

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O1

void anon_unknown.dwarf_156821::fillPixels1(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  long lVar1;
  ushort uVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  ushort uVar6;
  uint uVar7;
  ushort uVar8;
  half *phVar9;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  uint16_t uVar13;
  ushort uVar14;
  ushort uVar15;
  int x;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  lVar5 = _imath_half_to_float_table;
  lVar1 = pixels->_sizeY;
  phVar9 = &pixels->_data->a;
  lVar12 = 0;
  do {
    fVar17 = (float)((uint)lVar12 & 1);
    uVar7 = (uint)fVar17 & 0x7fffff | 0x800000;
    cVar3 = (char)((uint)fVar17 >> 0x17);
    uVar11 = (uint)fVar17 >> 0xd & 0x3ff;
    uVar10 = (ushort)uVar11 | 0x7c00 | (ushort)(uVar11 == 0);
    uVar2 = (ushort)((int)fVar17 + 0x8000fff + (uint)(((uint)fVar17 >> 0xd & 1) != 0) >> 0xd);
    if (0x477fefff < (uint)fVar17) {
      uVar2 = 0x7c00;
    }
    if (fVar17 == INFINITY) {
      uVar10 = 0x7c00;
    }
    lVar16 = 0;
    do {
      fVar18 = (float)((uint)lVar16 & 1);
      if ((uint)fVar18 < 0x38800000) {
        if ((uint)fVar18 < 0x33000001) {
          uVar14 = 0;
        }
        else {
          uVar11 = (uint)fVar18 & 0x7fffff | 0x800000;
          cVar4 = (char)((uint)fVar18 >> 0x17);
          uVar14 = (ushort)(uVar11 >> (0x7eU - cVar4 & 0x1f));
          if (0x80000000 < uVar11 << (cVar4 + 0xa2U & 0x1f)) {
            uVar14 = uVar14 + 1;
          }
        }
      }
      else if ((uint)fVar18 < 0x7f800000) {
        if ((uint)fVar18 < 0x477ff000) {
          uVar14 = (ushort)((int)fVar18 + 0x8000fff + (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd)
          ;
        }
        else {
          uVar14 = 0x7c00;
        }
      }
      else {
        uVar14 = 0x7c00;
        if (fVar18 != INFINITY) {
          uVar11 = (uint)fVar18 >> 0xd & 0x3ff;
          uVar14 = (ushort)(uVar11 == 0) | (ushort)uVar11 | 0x7c00;
        }
      }
      fVar18 = (float)((uint)lVar12 + (uint)lVar16 & 1);
      phVar9[lVar16 * 4 + -3]._h = uVar14;
      if ((uint)fVar18 < 0x38800000) {
        if ((uint)fVar18 < 0x33000001) {
          uVar15 = 0;
        }
        else {
          uVar11 = (uint)fVar18 & 0x7fffff | 0x800000;
          cVar4 = (char)((uint)fVar18 >> 0x17);
          uVar15 = (ushort)(uVar11 >> (0x7eU - cVar4 & 0x1f));
          if (0x80000000 < uVar11 << (cVar4 + 0xa2U & 0x1f)) {
            uVar15 = uVar15 + 1;
          }
        }
      }
      else if ((uint)fVar18 < 0x7f800000) {
        if ((uint)fVar18 < 0x477ff000) {
          uVar15 = (ushort)((int)fVar18 + 0x8000fff + (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd)
          ;
        }
        else {
          uVar15 = 0x7c00;
        }
      }
      else {
        uVar15 = 0x7c00;
        if (fVar18 != INFINITY) {
          uVar11 = (uint)fVar18 >> 0xd & 0x3ff;
          uVar15 = (ushort)(uVar11 == 0) | (ushort)uVar11 | 0x7c00;
        }
      }
      uVar6 = uVar2;
      if (0x7f7fffff < (uint)fVar17) {
        uVar6 = uVar10;
      }
      uVar8 = (ushort)(0x80000000 < uVar7 << (cVar3 + 0xa2U & 0x1f)) +
              (short)(uVar7 >> (0x7eU - cVar3 & 0x1f));
      if ((uint)fVar17 < 0x33000001) {
        uVar8 = 0;
      }
      phVar9[lVar16 * 4 + -2]._h = uVar15;
      if (0x387fffff < (uint)fVar17) {
        uVar8 = uVar6;
      }
      phVar9[lVar16 * 4 + -1]._h = uVar8;
      fVar19 = (*(float *)(lVar5 + (ulong)uVar14 * 4) + *(float *)(lVar5 + (ulong)uVar8 * 4) +
               *(float *)(lVar5 + (ulong)uVar15 * 4)) / 3.0;
      fVar18 = ABS(fVar19);
      uVar13 = (ushort)((uint)fVar19 >> 0x10) & 0x8000;
      if ((uint)fVar18 < 0x38800000) {
        if ((0x33000000 < (uint)fVar18) &&
           (uVar11 = (uint)fVar18 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar18 >> 0x17),
           uVar13 = uVar13 | (ushort)(uVar11 >> (0x7eU - cVar4 & 0x1f)),
           0x80000000 < uVar11 << (cVar4 + 0xa2U & 0x1f))) {
          uVar13 = uVar13 + 1;
        }
      }
      else if ((uint)fVar18 < 0x7f800000) {
        if ((uint)fVar18 < 0x477ff000) {
          uVar13 = (ushort)((int)fVar18 + 0x8000fff + (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd)
                   | uVar13;
        }
        else {
          uVar13 = uVar13 | 0x7c00;
        }
      }
      else {
        uVar13 = uVar13 | 0x7c00;
        if (fVar18 != INFINITY) {
          uVar11 = (uint)fVar18 >> 0xd & 0x3ff;
          uVar13 = uVar13 | (ushort)uVar11 | (ushort)(uVar11 == 0);
        }
      }
      phVar9[lVar16 * 4]._h = uVar13;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x77);
    lVar12 = lVar12 + 1;
    phVar9 = phVar9 + lVar1 * 4;
  } while (lVar12 != 0xed);
  return;
}

Assistant:

void
fillPixels1 (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = (x & 1);
            p.g = ((x + y) & 1);
            p.b = (y & 1);
            p.a = (p.r + p.b + p.g) / 3.0;
        }
    }
}